

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall Fl_Text_Display::insert_position(Fl_Text_Display *this,int newPos)

{
  int iVar1;
  int iVar2;
  Fl_Text_Buffer *pFVar3;
  int local_14;
  int newPos_local;
  Fl_Text_Display *this_local;
  
  if (newPos != this->mCursorPos) {
    local_14 = newPos;
    if (newPos < 0) {
      local_14 = 0;
    }
    iVar1 = Fl_Text_Buffer::length(this->mBuffer);
    if (iVar1 < local_14) {
      local_14 = Fl_Text_Buffer::length(this->mBuffer);
    }
    this->mCursorPreferredXPos = -1;
    pFVar3 = buffer(this);
    iVar1 = Fl_Text_Buffer::prev_char_clipped(pFVar3,this->mCursorPos);
    pFVar3 = buffer(this);
    iVar2 = Fl_Text_Buffer::next_char(pFVar3,this->mCursorPos);
    redisplay_range(this,iVar1,iVar2);
    this->mCursorPos = local_14;
    pFVar3 = buffer(this);
    iVar1 = Fl_Text_Buffer::prev_char_clipped(pFVar3,this->mCursorPos);
    pFVar3 = buffer(this);
    iVar2 = Fl_Text_Buffer::next_char(pFVar3,this->mCursorPos);
    redisplay_range(this,iVar1,iVar2);
  }
  return;
}

Assistant:

void Fl_Text_Display::insert_position( int newPos ) {
  IS_UTF8_ALIGNED2(buffer(), newPos)

  /* make sure new position is ok, do nothing if it hasn't changed */
  if ( newPos == mCursorPos ) return;
  if ( newPos < 0 ) newPos = 0;
  if ( newPos > mBuffer->length() ) newPos = mBuffer->length();

  /* cursor movement cancels vertical cursor motion column */
  mCursorPreferredXPos = -1;

  /* erase the cursor at its previous position */
  redisplay_range(buffer()->prev_char_clipped(mCursorPos), buffer()->next_char(mCursorPos));

  mCursorPos = newPos;

  /* draw cursor at its new position */
  redisplay_range(buffer()->prev_char_clipped(mCursorPos), buffer()->next_char(mCursorPos));
}